

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_influence.h
# Opt level: O3

void __thiscall
xray_re::_influence<unsigned_int,_float>::set
          (_influence<unsigned_int,_float> *this,size_t num_bones,uint16_t *bones,float *weights)

{
  ushort uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  
  if (num_bones != 0) {
    fVar5 = 0.0;
    do {
      num_bones = num_bones - 1;
      if (num_bones == 0) {
        fVar6 = 1.0 - fVar5;
      }
      else {
        fVar6 = *weights;
        weights = weights + 1;
        fVar5 = fVar5 + fVar6;
      }
      uVar1 = *bones;
      uVar2 = (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count;
      uVar3 = (ulong)uVar2;
      if (uVar3 != 0) {
        lVar4 = 0;
        do {
          if (*(uint *)((long)&(this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>
                               ).array[0].bone + lVar4) == (uint)uVar1) goto LAB_001623b0;
          lVar4 = lVar4 + 8;
        } while (uVar3 * 8 - lVar4 != 0);
        if (3 < uVar2) {
          __assert_fail("count < N",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_fixed_vector.h"
                        ,0x5b,
                        "void xray_re::_svector<xray_re::_bone_weight<unsigned int, float>, 4>::push_back(const T &) [T = xray_re::_bone_weight<unsigned int, float>, N = 4]"
                       );
        }
      }
      (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).count = uVar2 + 1;
      (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar3].bone =
           (uint)uVar1;
      (this->super__svector<xray_re::_bone_weight<unsigned_int,_float>,_4U>).array[uVar3].weight =
           fVar6;
LAB_001623b0:
      bones = bones + 1;
    } while (num_bones != 0);
  }
  reorder(this);
  return;
}

Assistant:

void _influence<Tb, Tw>::set(size_t num_bones, const uint16_t* bones, const float* weights)
{
	for (float sum = 0, w; num_bones;) {
		if (--num_bones == 0) {
			w = 1.f - sum;
		} else {
			w = *weights++;
			sum += w;
		}
		_bone_weight<Tb, Tw> bw(*bones++, w);
		for (typename _influence<Tb, Tw>::iterator it = _influence<Tb, Tw>::begin(),
				last = _influence<Tb, Tw>::end(); it != last; ++it) {
			if (it->bone == bw.bone) {
#if 0
				if (!equivalent<Tw>(w, 0)) {
					msg("bone%u, w=%f", bw.bone, w);
				}
				xr_assert(equivalent<Tw>(w, 0));
#endif
				goto skip;
			}
		}
		push_back(bw);
skip:;
	}
	reorder();
}